

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O0

void cmAppend<char,std::_Deque_iterator<char,char&,char*>>
               (vector<char,_std::allocator<char>_> *v,_Deque_iterator<char,_char_&,_char_*> *first,
               _Deque_iterator<char,_char_&,_char_*> *last)

{
  _Deque_iterator<char,_char_&,_char_*> local_70;
  _Deque_iterator<char,_char_&,_char_*> local_50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  const_iterator local_28;
  _Deque_iterator<char,_char_&,_char_*> *local_20;
  _Deque_iterator<char,_char_&,_char_*> *last_local;
  _Deque_iterator<char,_char_&,_char_*> *first_local;
  vector<char,_std::allocator<char>_> *v_local;
  
  local_20 = last;
  last_local = first;
  first_local = (_Deque_iterator<char,_char_&,_char_*> *)v;
  local_30._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(v);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_28,
             &local_30);
  std::_Deque_iterator<char,_char_&,_char_*>::_Deque_iterator(&local_50,first);
  std::_Deque_iterator<char,_char_&,_char_*>::_Deque_iterator(&local_70,last);
  std::vector<char,std::allocator<char>>::insert<std::_Deque_iterator<char,char&,char*>,void>
            ((vector<char,std::allocator<char>> *)v,local_28,&local_50,&local_70);
  return;
}

Assistant:

void cmAppend(std::vector<T>& v, InputIt first, InputIt last)
{
  v.insert(v.end(), first, last);
}